

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O1

int pztopology::TPZLine::GetTransformId(int side,TPZVec<long> *id)

{
  int iVar1;
  
  iVar1 = 0;
  if (1 < (uint)side) {
    if (side == 2) {
      return (int)(id->fStore[1] <= *id->fStore);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Wrong input parameter",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int TPZLine::GetTransformId(const int side, const TPZVec<int64_t> &id)
	{
		switch (side) {
			case 0:
			case 1:
				return 0;
				break;
			case 2:
				return id[0] < id[1] ? 0 : 1;
			default:
				break;
		}
		LOGPZ_ERROR(logger,"Wrong input parameter")
		return -1;
	}